

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_map_reduce_tests.cpp
# Opt level: O0

void __thiscall
omp_tuple_reduce_tuple_multiple_tuples_Test::TestBody
          (omp_tuple_reduce_tuple_multiple_tuples_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_d0;
  Message local_c8 [3];
  double local_b0;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar;
  int local_90 [2];
  int result;
  char local_81;
  double local_80;
  int local_74;
  undefined1 local_70 [8];
  tuple<int,_double,_char,_int,_int> expected2;
  int local_48;
  char local_41;
  double local_40;
  int local_34;
  undefined1 local_30 [8];
  tuple<int,_double,_char,_int,_int> expected1;
  omp_tuple_reduce_tuple_multiple_tuples_Test *this_local;
  
  local_34 = 1;
  local_40 = 2.0;
  local_41 = 'a';
  local_48 = 4;
  expected2.super__Tuple_impl<0UL,_int,_double,_char,_int,_int>._28_4_ = 5;
  expected1.super__Tuple_impl<0UL,_int,_double,_char,_int,_int>._24_8_ = this;
  std::make_tuple<int,double,char,int,int>
            ((tuple<int,_double,_char,_int,_int> *)local_30,&local_34,&local_40,&local_41,&local_48,
             (int *)&expected2.super__Tuple_impl<0UL,_int,_double,_char,_int,_int>.field_0x1c);
  local_74 = 5;
  local_80 = 4.0;
  local_81 = 'z';
  result = 2;
  local_90[1] = 1;
  std::make_tuple<int,double,char,int,int>
            ((tuple<int,_double,_char,_int,_int> *)local_70,&local_74,&local_80,&local_81,&result,
             local_90 + 1);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0;
  local_90[0] = omp::
                tuple_reduce<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_CallOfCrutches[P]omp_utils_tests_omp_utils_tuple_map_reduce_tests_cpp:249:7),_int,_std::tuple<int,_double,_char,_int,_int>_&,_const_std::tuple<int,_double,_char,_int,_int>_&,_0>
                          ((anon_class_1_0_00000001 *)
                           ((long)&gtest_ar.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           + 7),(int *)&gtest_ar.message_,
                           (tuple<int,_double,_char,_int,_int> *)local_30,
                           (tuple<int,_double,_char,_int,_int> *)local_70);
  local_b0 = 243.0;
  testing::internal::EqHelper::Compare<int,_double,_nullptr>
            ((EqHelper *)local_a8,"result","1 + 2.0 + \'a\' + 4 + 5 + 5 + 4.0 + \'z\' + 2 + 1",
             local_90,&local_b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(local_c8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CallOfCrutches[P]omp_utils/tests/omp/utils/tuple_map_reduce_tests.cpp"
               ,0xfc,message);
    testing::internal::AssertHelper::operator=(&local_d0,local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    testing::Message::~Message(local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  return;
}

Assistant:

TEST(omp_tuple_reduce_tuple, multiple_tuples) {
  auto expected1 = std::make_tuple(1, 2.0, 'a', 4, 5);
  auto expected2 = std::make_tuple(5, 4.0, 'z', 2, 1);

  auto result = omp::tuple_reduce(
      [](auto accum, auto &val1, auto &val2) { return accum + val1 + val2; }, 0,
      expected1, std::as_const(expected2));

  ASSERT_EQ(result, 1 + 2.0 + 'a' + 4 + 5 + 5 + 4.0 + 'z' + 2 + 1);
}